

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConn.cpp
# Opt level: O1

void __thiscall TcpConn::OnData(TcpConn *this)

{
  Buffer *this_00;
  uint16_t uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  char *pcVar4;
  ssize_t sVar5;
  undefined4 extraout_var_00;
  long *plVar6;
  ostream *this_02;
  int *piVar7;
  size_t in_RCX;
  BufferChain *this_01;
  
  iVar2 = (*(this->super_PollObj)._vptr_PollObj[9])();
  this_01 = (BufferChain *)CONCAT44(extraout_var,iVar2);
  this_00 = &this->super_Buffer;
  do {
    pcVar4 = BufferChain::GetWriteAddr(this_01);
    uVar1 = BufferChain::GetCanWriteCount(this_01);
    sVar5 = TcpSocket::read(&this->m_socket,(int)pcVar4,(void *)(ulong)uVar1,in_RCX);
    iVar2 = (int)sVar5;
    if (iVar2 < 0) {
      Buffer::AddReaChain(this_00,this_01);
      piVar7 = __errno_location();
      iVar3 = 3;
      if (*piVar7 != 0xb) {
        this_02 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
        std::__ostream_insert<char,std::char_traits<char>>(this_02,":",1);
        iVar2 = *piVar7;
        goto LAB_00105626;
      }
    }
    else if (iVar2 == 0) {
      Buffer::AddReaChain(this_00,this_01);
      this_02 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0);
      std::__ostream_insert<char,std::char_traits<char>>(this_02,":",1);
      piVar7 = __errno_location();
      iVar2 = *piVar7;
LAB_00105626:
      plVar6 = (long *)std::ostream::operator<<(this_02,iVar2);
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
      std::ostream::put((char)plVar6);
      std::ostream::flush();
      (*(this->super_PollObj)._vptr_PollObj[8])(this);
      iVar3 = 1;
    }
    else {
      this_01->write = this_01->write + (short)sVar5;
      uVar1 = BufferChain::GetCanWriteCount(this_01);
      if (uVar1 == 0) {
        Buffer::AddReaChain(this_00,this_01);
        iVar3 = (*(this->super_PollObj)._vptr_PollObj[9])(this);
        this_01 = (BufferChain *)CONCAT44(extraout_var_00,iVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"read ",5);
      plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
      std::ostream::put((char)plVar6);
      std::ostream::flush();
      iVar3 = 0;
    }
    if (iVar3 != 0) {
      if (iVar3 == 3) {
        TmpSend(this);
        (*(this->super_PollObj)._vptr_PollObj[7])(this);
        return;
      }
      return;
    }
  } while( true );
}

Assistant:

void TcpConn::OnData()
{
    BufferChain* buff = this->Alloc();
    while (true)
    {    
        //TODO最后一次内存泄漏
        //既然用了et 这里要改 要一次性读完
        int ret = m_socket.read(buff->GetWriteAddr(), buff->GetCanWriteCount());
        if(ret < 0)
        {
            this->AddReaChain(buff);
            if(errno == EAGAIN || errno == EWOULDBLOCK)
            {
                break;
            }
            else
            {
                std::cout << ret << ":" << errno << std::endl;
                this->OnConnError();
                return;
            }
        }
        else if(ret == 0)
        {
            this->AddReaChain(buff);
            std::cout << ret << ":" << errno << std::endl;
            this->OnConnError();
            return;
        }
        buff->write += ret;
        if(buff->GetCanWriteCount() == 0)
        {
            this->AddReaChain(buff);
            buff = this->Alloc();
        }
        std::cout << "read " << ret << std::endl;

    }

    this->TmpSend();
    this->OnConnData();
}